

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QBGPlanner_TreeIncPruneBnB.cpp
# Opt level: O0

void __thiscall
QBGPlanner_TreeIncPruneBnB::QBGPlanner_TreeIncPruneBnB
          (QBGPlanner_TreeIncPruneBnB *this,PlanningUnitDecPOMDPDiscrete *pu)

{
  undefined8 *in_RDI;
  undefined8 in_stack_ffffffffffffffc0;
  PlanningUnitDecPOMDPDiscrete *in_stack_ffffffffffffffc8;
  MonahanBGPlanner *in_stack_ffffffffffffffd0;
  Timing *in_stack_ffffffffffffffe0;
  
  MonahanBGPlanner::MonahanBGPlanner
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x38,0));
  *in_RDI = &PTR__QBGPlanner_TreeIncPruneBnB_00d10738;
  in_RDI[0x34] = 0;
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
            *)0x94c516);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x94c52c);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x94c542);
  *(undefined1 *)((long)in_RDI + 0x20c) = 1;
  *(undefined1 *)((long)in_RDI + 0x20d) = 1;
  *(undefined1 *)((long)in_RDI + 0x20e) = 1;
  Timing::Timing(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

QBGPlanner_TreeIncPruneBnB::QBGPlanner_TreeIncPruneBnB(const PlanningUnitDecPOMDPDiscrete* pu) :
    MonahanBGPlanner(pu),
    _m_Gaoa(0),
    _m_pruneAfterUnion(true),
    _m_pruneAfterCrossSum(true),
    _m_useVectorCache(true)
{
}